

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttobjs.c
# Opt level: O2

FT_Error tt_size_run_prep(TT_Size size,FT_Bool pedantic)

{
  TT_Face face;
  ulong uVar1;
  TT_ExecContext exec;
  FT_ULong FVar2;
  FT_Byte *pFVar3;
  FT_UShort FVar4;
  FT_UShort FVar5;
  FT_F2Dot14 FVar6;
  FT_Error FVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  TT_GraphicsState *pTVar11;
  TT_GraphicsState *pTVar12;
  byte bVar13;
  
  bVar13 = 0;
  face = (TT_Face)(size->root).face;
  uVar1 = (size->ttmetrics).scale;
  for (uVar8 = 0; uVar9 = (ulong)uVar8, uVar9 < size->cvt_size; uVar8 = uVar8 + 1) {
    lVar10 = (long)face->cvt[uVar9] * (long)(int)(uVar1 >> 6);
    size->cvt[uVar9] = (long)(int)((ulong)(lVar10 + (lVar10 >> 0x3f) + 0x8000) >> 0x10);
  }
  exec = size->context;
  FVar7 = TT_Load_Context(exec,face,size);
  if (FVar7 == 0) {
    exec->callTop = 0;
    exec->top = 0;
    exec->instruction_trap = '\0';
    exec->pedantic_hinting = pedantic;
    FVar2 = face->cvt_program_size;
    pFVar3 = face->cvt_program;
    exec->codeRangeTable[1].base = pFVar3;
    exec->codeRangeTable[1].size = FVar2;
    exec->codeRangeTable[2].base = (FT_Byte *)0x0;
    exec->codeRangeTable[2].size = 0;
    if (face->cvt_program_size == 0) {
      FVar7 = 0;
    }
    else {
      exec->code = pFVar3;
      exec->codeSize = FVar2;
      exec->IP = 0;
      exec->curRange = 2;
      FVar7 = (*face->interpreter)(exec);
    }
    size->cvt_ready = FVar7;
    (exec->GS).freeVector.y = 0;
    (exec->GS).rp0 = 0;
    (exec->GS).rp1 = 0;
    (exec->GS).rp2 = 0;
    (exec->GS).dualVector.x = 0x4000;
    *(undefined8 *)&(exec->GS).dualVector.y = 0x4000000040000000;
    (exec->GS).gep0 = 1;
    (exec->GS).gep1 = 1;
    (exec->GS).gep2 = 1;
    (exec->GS).loop = 1;
    pTVar11 = &exec->GS;
    pTVar12 = &size->GS;
    for (lVar10 = 0xc; lVar10 != 0; lVar10 = lVar10 + -1) {
      FVar4 = pTVar11->rp1;
      FVar5 = pTVar11->rp2;
      FVar6 = (pTVar11->dualVector).x;
      pTVar12->rp0 = pTVar11->rp0;
      pTVar12->rp1 = FVar4;
      pTVar12->rp2 = FVar5;
      (pTVar12->dualVector).x = FVar6;
      pTVar11 = (TT_GraphicsState *)((long)pTVar11 + (ulong)bVar13 * -0x10 + 8);
      pTVar12 = (TT_GraphicsState *)((long)pTVar12 + (ulong)bVar13 * -0x10 + 8);
    }
    TT_Save_Context(exec,size);
  }
  return FVar7;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_size_run_prep( TT_Size  size,
                    FT_Bool  pedantic )
  {
    TT_Face         face = (TT_Face)size->root.face;
    TT_ExecContext  exec;
    FT_Error        error;
    FT_UInt         i;

    /* unscaled CVT values are already stored in 26.6 format */
    FT_Fixed  scale = size->ttmetrics.scale >> 6;


    /* Scale the cvt values to the new ppem.            */
    /* By default, we use the y ppem value for scaling. */
    FT_TRACE6(( "CVT values:\n" ));
    for ( i = 0; i < size->cvt_size; i++ )
    {
      size->cvt[i] = FT_MulFix( face->cvt[i], scale );
      FT_TRACE6(( "  %3d: %f (%f)\n",
                  i, (double)face->cvt[i] / 64, (double)size->cvt[i] / 64 ));
    }
    FT_TRACE6(( "\n" ));

    exec = size->context;

    error = TT_Load_Context( exec, face, size );
    if ( error )
      return error;

    exec->callTop = 0;
    exec->top     = 0;

    exec->instruction_trap = FALSE;

    exec->pedantic_hinting = pedantic;

    TT_Set_CodeRange( exec,
                      tt_coderange_cvt,
                      face->cvt_program,
                      (FT_Long)face->cvt_program_size );

    TT_Clear_CodeRange( exec, tt_coderange_glyph );

    if ( face->cvt_program_size > 0 )
    {
      TT_Goto_CodeRange( exec, tt_coderange_cvt, 0 );

      FT_TRACE4(( "Executing `prep' table.\n" ));
      error = face->interpreter( exec );
#ifdef FT_DEBUG_LEVEL_TRACE
      if ( error )
        FT_TRACE4(( "  interpretation failed with error code 0x%x\n",
                    error ));
#endif
    }
    else
      error = FT_Err_Ok;

    size->cvt_ready = error;

    /* UNDOCUMENTED!  The MS rasterizer doesn't allow the following */
    /* graphics state variables to be modified by the CVT program.  */

    exec->GS.dualVector.x = 0x4000;
    exec->GS.dualVector.y = 0;
    exec->GS.projVector.x = 0x4000;
    exec->GS.projVector.y = 0x0;
    exec->GS.freeVector.x = 0x4000;
    exec->GS.freeVector.y = 0x0;

    exec->GS.rp0 = 0;
    exec->GS.rp1 = 0;
    exec->GS.rp2 = 0;

    exec->GS.gep0 = 1;
    exec->GS.gep1 = 1;
    exec->GS.gep2 = 1;

    exec->GS.loop = 1;

    /* save as default graphics state */
    size->GS = exec->GS;

    TT_Save_Context( exec, size );

    return error;
  }